

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NC.hpp
# Opt level: O1

long __thiscall njoy::ENDFtk::section::ReactionBlock::NC(ReactionBlock *this)

{
  pointer pvVar1;
  pointer pvVar2;
  variant<njoy::ENDFtk::section::DerivedRedundant,_njoy::ENDFtk::section::DerivedRatioToStandard>
  *nc;
  pointer __variants;
  pointer __variants_00;
  long result;
  anon_class_8_1_6971b95b local_38;
  long local_30;
  
  local_30 = 1;
  __variants = (this->nc_).
               super__Vector_base<std::variant<njoy::ENDFtk::section::DerivedRedundant,_njoy::ENDFtk::section::DerivedRatioToStandard>,_std::allocator<std::variant<njoy::ENDFtk::section::DerivedRedundant,_njoy::ENDFtk::section::DerivedRatioToStandard>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
  pvVar1 = (this->nc_).
           super__Vector_base<std::variant<njoy::ENDFtk::section::DerivedRedundant,_njoy::ENDFtk::section::DerivedRatioToStandard>,_std::allocator<std::variant<njoy::ENDFtk::section::DerivedRedundant,_njoy::ENDFtk::section::DerivedRatioToStandard>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (__variants != pvVar1) {
    do {
      local_38.result = &local_30;
      std::
      visit<njoy::ENDFtk::section::ReactionBlock::NC()const::_lambda(auto:1_const&)_1_,std::variant<njoy::ENDFtk::section::DerivedRedundant,njoy::ENDFtk::section::DerivedRatioToStandard>const&>
                (&local_38,__variants);
      __variants = __variants + 1;
    } while (__variants != pvVar1);
  }
  __variants_00 =
       (this->ni_).
       super__Vector_base<std::variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix,_njoy::ENDFtk::section::RectangularMatrix>,_std::allocator<std::variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix,_njoy::ENDFtk::section::RectangularMatrix>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  pvVar2 = (this->ni_).
           super__Vector_base<std::variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix,_njoy::ENDFtk::section::RectangularMatrix>,_std::allocator<std::variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix,_njoy::ENDFtk::section::RectangularMatrix>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (__variants_00 != pvVar2) {
    do {
      local_38.result = &local_30;
      std::
      visit<njoy::ENDFtk::section::ReactionBlock::NC()const::_lambda(auto:1_const&)_2_,std::variant<njoy::ENDFtk::section::CovariancePairs,njoy::ENDFtk::section::SquareMatrix,njoy::ENDFtk::section::RectangularMatrix>const&>
                (&local_38,__variants_00);
      __variants_00 = __variants_00 + 1;
    } while (__variants_00 != pvVar2);
  }
  return local_30;
}

Assistant:

long NC() const {

  long result = 1;

  // NC subsubsections
  for ( const auto& nc : this->nc_ ) {
    std::visit( [&] ( const auto& v ) -> void
                    { result += v.NC(); },
                nc );
  }

  // NI subsubsections
  for ( const auto& ni : this->ni_ ) {
    std::visit( [&] ( const auto& v ) -> void
                    { result += v.NC(); },
                ni );
  }

  return result;

}